

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86SBB(uchar *stream,x86Reg dst,x86Reg src)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg src_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,src,rNONE,dst);
  puVar3 = stream + uVar2;
  *puVar3 = '\x19';
  uVar1 = encodeRegister(dst,regCode[src]);
  puVar3[1] = uVar1;
  return ((int)puVar3 + 2) - (int)stream;
}

Assistant:

int x86SBB(unsigned char *stream, x86Reg dst, x86Reg src)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, src, rNONE, dst);
	*stream++ = 0x19;
	*stream++ = encodeRegister(dst, regCode[src]);

	return int(stream - start);
}